

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O3

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:198:29)>_>
::run(Stats *__return_storage_ptr__,
     Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:198:29)>_>
     *this,PathList *pathList,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results,
     size_t depth)

{
  pointer *ppSVar1;
  Results *pRVar2;
  pointer pcVar3;
  iterator iVar4;
  unique_ptr<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
  uVar5;
  undefined8 uVar6;
  bool bVar7;
  long *plVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pSVar12;
  long lVar13;
  long lVar14;
  string *psVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float result_a;
  float result_d;
  float result_c;
  float result_b;
  float result_a_1;
  Finally stack;
  Finally stack_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  ulong local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  ulong *local_410;
  undefined8 local_408;
  ulong local_400;
  undefined8 uStack_3f8;
  int local_3f0;
  float local_3ec [5];
  BaseFunctor **local_3d8;
  undefined8 local_3d0;
  BaseFunctor *local_3c8;
  undefined8 uStack_3c0;
  Finally local_3b8;
  string local_3a8;
  ulong local_388;
  string local_380;
  ContextResultsRecorder *local_360;
  string *local_358;
  Stats *local_350;
  NameStack *local_348;
  Finally local_340;
  Finally local_330;
  undefined1 local_320 [16];
  long lStack_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined **local_2d8;
  ContextResultsRecorder *local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  char *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  uint64_t uStack_258;
  undefined1 local_250 [16];
  uint64_t local_240;
  long local_238;
  long lStack_230;
  StackElement local_228;
  StackElement local_218;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>
  local_208;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::Literal<int>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>
  local_f8;
  
  psVar15 = &this->name;
  pRVar2 = ((results.value)->results_).value;
  local_348 = &(results.value)->contextStack_;
  (*pRVar2->_vptr_Results[5])(pRVar2,local_348,psVar15);
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  __return_storage_ptr__->failedChecks_ = 0;
  bVar7 = included(this,(PathList *)
                        (pathList->
                        super__Vector_base<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                   (size_t)(pathList->
                           super__Vector_base<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
  if (bVar7) {
    pcVar3 = (this->name)._M_dataplus._M_p;
    local_288 = &local_278;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,pcVar3,pcVar3 + (this->name)._M_string_length);
    local_2c0 = local_280;
    local_320._0_8_ = &PTR__WhenRunner_0016cc28;
    local_308 = (undefined1  [16])0x0;
    local_2f8 = (undefined1  [16])0x0;
    local_2e8 = (undefined1  [16])0x0;
    if (local_288 == &local_278) {
      local_208.lhs._8_8_ = uStack_270;
      local_288 = (undefined1 *)((long)&local_208 + 0x10);
    }
    local_208.lhs.operatorName = (char *)CONCAT71(uStack_277,local_278);
    local_280 = 0;
    local_278 = 0;
    local_2d8 = &PTR__WhenResultRecorder_0016cc78;
    local_2c8 = local_288;
    if (local_288 == (undefined1 *)((long)&local_208 + 0x10)) {
      local_2b8[1] = (char *)local_208.lhs._8_8_;
      local_2c8 = (undefined1 *)local_2b8;
    }
    local_2b8[0] = local_208.lhs.operatorName;
    local_2a8 = (undefined1  [16])0x0;
    local_298 = (undefined1  [16])0x0;
    stack0xfffffffffffffce8 = ZEXT816(1);
    plVar9 = (long *)0x0;
    plVar8 = (long *)0x0;
    auVar20 = _DAT_00159240;
    auVar21 = _DAT_00159010;
    local_360 = results.value;
    local_358 = psVar15;
    local_350 = __return_storage_ptr__;
    local_2d0 = results.value;
    local_288 = &local_278;
    do {
      if (plVar8 != plVar9) {
        uVar10 = (long)plVar9 + (-0x10 - (long)plVar8);
        auVar19._8_4_ = (int)uVar10;
        auVar19._0_8_ = uVar10;
        auVar19._12_4_ = (int)(uVar10 >> 0x20);
        auVar17._0_8_ = uVar10 >> 4;
        auVar17._8_8_ = auVar19._8_8_ >> 4;
        plVar8 = plVar8 + 3;
        auVar17 = auVar17 ^ auVar21;
        uVar11 = 0;
        do {
          auVar18._8_4_ = (int)uVar11;
          auVar18._0_8_ = uVar11;
          auVar18._12_4_ = (int)(uVar11 >> 0x20);
          auVar19 = (auVar18 | auVar20) ^ auVar21;
          if ((bool)(~(auVar17._4_4_ < auVar19._4_4_ ||
                      auVar17._0_4_ < auVar19._0_4_ && auVar19._4_4_ == auVar17._4_4_) & 1)) {
            plVar8[-2] = 0;
          }
          if (auVar19._12_4_ <= auVar17._12_4_ &&
              (auVar19._8_4_ <= auVar17._8_4_ || auVar19._12_4_ != auVar17._12_4_)) {
            *plVar8 = 0;
          }
          uVar11 = uVar11 + 2;
          plVar8 = plVar8 + 4;
        } while (((uVar10 >> 4) + 2 & 0xfffffffffffffffe) != uVar11);
      }
      local_268._0_8_ = local_320;
      local_250 = (undefined1  [16])0x0;
      stack0xfffffffffffffda0 = (undefined1  [16])0x0;
      local_240 = 0;
      local_3b8.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )(__uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              )0x25;
      local_3d8 = &local_3c8;
      local_450 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)::std::__cxx11::string::_M_create((ulong *)&local_3d8,(ulong)&local_3b8);
      uVar6 = local_268._0_8_;
      uVar5._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )(__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
              )local_3b8.functor;
      *(undefined8 *)(local_450->_M_local_buf + 0x10) = 0x20736920656e6f20;
      *(undefined8 *)(local_450->_M_local_buf + 0x18) = 0x76206f72657a2061;
      local_450->_M_allocated_capacity = 0x747361656c207461;
      *(undefined8 *)(local_450->_M_local_buf + 8) = 0x6d65687420666f20;
      *(char *)((long)local_450 + 0x1d) = 'o';
      *(char *)((long)local_450 + 0x1e) = ' ';
      *(char *)((long)local_450 + 0x1f) = 'v';
      *(char *)((long)local_450 + 0x20) = 'e';
      *(char *)((long)local_450 + 0x21) = 'c';
      *(char *)((long)local_450 + 0x22) = 't';
      *(char *)((long)local_450 + 0x23) = 'o';
      *(char *)((long)local_450 + 0x24) = 'r';
      local_450->_M_local_buf
      [(long)local_3b8.functor._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl] = '\0';
      if (local_450 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_3c8) {
        local_440._8_8_ = uStack_3c0;
        local_450 = &local_440;
      }
      local_440._M_allocated_capacity =
           (size_type)
           local_3b8.functor._M_t.
           super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
           ._M_t.
           super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
           .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl;
      local_3d0 = 0;
      local_3c8 = (BaseFunctor *)
                  ((ulong)local_3b8.functor._M_t.
                          super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
                          .
                          super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>
                          ._M_head_impl & 0xffffffffffffff00);
      pSVar12 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                   *)(local_268._0_8_ + 0x30))->
                super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
              *)(local_268._0_8_ + 0x30))->
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      uVar10 = *(size_t *)(local_268._0_8_ + 0x90);
      local_3d8 = &local_3c8;
      if ((ulong)((long)iVar4._M_current - (long)pSVar12 >> 4) <= uVar10) {
        local_228.index = 0;
        local_228.current = 0;
        if (iVar4._M_current ==
            (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               *)(local_268._0_8_ + 0x30))->
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ::_M_realloc_insert<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                    ((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                      *)(local_268._0_8_ + 0x30),iVar4,&local_228);
        }
        else {
          (iVar4._M_current)->index = 0;
          (iVar4._M_current)->current = 0;
          ppSVar1 = &(((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        *)(local_268._0_8_ + 0x30))->
                     super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        pSVar12 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     *)(uVar6 + 0x30))->
                  super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = *(size_t *)(uVar6 + 0x90);
      }
      local_340.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      ((BaseFunctor *)
      local_340.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl)->
      _vptr_BaseFunctor = (_func_int **)&PTR__BaseFunctor_0016c498;
      ((BaseFunctor *)
      ((long)local_340.functor._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)uVar6;
      local_340.valid = true;
      if (pSVar12[uVar10].index == pSVar12[uVar10].current) {
        *(ulong *)(uVar6 + 0x90) = uVar10 + 1;
        if (local_450 == &local_440) {
          local_3a8.field_2._8_8_ = local_440._8_8_;
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        }
        else {
          local_3a8._M_dataplus._M_p = (pointer)local_450;
        }
        local_3a8.field_2._M_allocated_capacity = local_440._M_allocated_capacity;
        local_3a8._M_string_length =
             (size_type)
             uVar5._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl;
        local_440._M_allocated_capacity = local_440._M_allocated_capacity & 0xffffffffffffff00;
        WhenResultRecorder::push((WhenResultRecorder *)(uVar6 + 0x48),&local_3a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,
                          (ulong)(local_3a8.field_2._M_allocated_capacity + 1));
        }
        local_3b8.functor._M_t.
        super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        ._M_t.
        super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
              )operator_new(0x10);
        *(undefined ***)
         local_3b8.functor._M_t.
         super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         ._M_t.
         super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             &PTR__BaseFunctor_0016c4d8;
        ((BaseFunctor *)
        ((long)local_3b8.functor._M_t.
               super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               ._M_t.
               super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
               _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)uVar6;
        local_3b8.valid = true;
        local_3ec[0] = 0.0;
        local_3f0 = 0;
        local_f8.lhs.operatorName = "&&";
        local_f8.lhs.lhs.operatorName = "&&";
        local_f8.lhs.lhs.lhs.operatorName = "==";
        local_f8.lhs.lhs.lhs.lhs.variableName = "result_a";
        local_f8.lhs.lhs.lhs.lhs.value = local_3ec;
        local_f8.lhs.lhs.lhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_f8.lhs.lhs.lhs.lhs.line = 0xd3;
        local_f8.lhs.lhs.lhs.rhs.value = &local_3f0;
        local_f8.lhs.lhs.rhs.variableName = "result_b == 0";
        local_f8.lhs.lhs.rhs.value = true;
        local_f8.lhs.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_f8.lhs.lhs.rhs.line = 0xd3;
        local_f8.lhs.rhs.variableName = "result_c == 0";
        local_f8.lhs.rhs.value = true;
        local_f8.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_f8.lhs.rhs.line = 0xd4;
        local_f8.rhs.variableName = "result_d == 0";
        local_f8.rhs.value = true;
        local_f8.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_f8.rhs.line = 0xd4;
        local_f8.operatorName = "&&";
        Check::
        operator()<const_char_(&)[22],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::Literal<int>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>_>
                  ((Check *)local_268,(char (*) [22])"cross product is zero",&local_f8);
        Enhedron::Impl::Util::Finally::~Finally(&local_3b8);
        local_450 = &local_440;
      }
      Enhedron::Impl::Util::Finally::~Finally(&local_340);
      if (local_450 != &local_440) {
        operator_delete(local_450,(ulong)(local_440._M_allocated_capacity + 1));
      }
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8,(ulong)((long)&local_3c8->_vptr_BaseFunctor + 1));
      }
      local_388 = 0x13;
      local_410 = &local_400;
      local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)::std::__cxx11::string::_M_create((ulong *)&local_410,(ulong)&local_388);
      uVar6 = local_268._0_8_;
      local_430->_M_allocated_capacity = 0x687420726568746f;
      *(undefined8 *)(local_430->_M_local_buf + 8) = 0x7061682073676e69;
      *(char *)((long)local_430->_M_local_buf + 0xf) = 'p';
      *(char *)((long)local_430 + 0x10) = 'p';
      *(char *)((long)local_430 + 0x11) = 'e';
      *(char *)((long)local_430 + 0x12) = 'n';
      local_430->_M_local_buf[local_388] = '\0';
      if (local_430 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_400) {
        local_420._8_8_ = uStack_3f8;
        local_430 = &local_420;
      }
      local_420._M_allocated_capacity = local_388;
      local_428 = local_388;
      local_408 = 0;
      local_400 = local_388 & 0xffffffffffffff00;
      pSVar12 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                   *)(local_268._0_8_ + 0x30))->
                super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
              *)(local_268._0_8_ + 0x30))->
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      uVar10 = *(size_t *)(local_268._0_8_ + 0x90);
      local_410 = &local_400;
      if ((ulong)((long)iVar4._M_current - (long)pSVar12 >> 4) <= uVar10) {
        local_218.index = 0;
        local_218.current = 0;
        if (iVar4._M_current ==
            (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               *)(local_268._0_8_ + 0x30))->
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ::_M_realloc_insert<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                    ((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                      *)(local_268._0_8_ + 0x30),iVar4,&local_218);
        }
        else {
          (iVar4._M_current)->index = 0;
          (iVar4._M_current)->current = 0;
          ppSVar1 = &(((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        *)(local_268._0_8_ + 0x30))->
                     super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        pSVar12 = (((vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     *)(uVar6 + 0x30))->
                  super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = *(size_t *)(uVar6 + 0x90);
      }
      local_330.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      ((BaseFunctor *)
      local_330.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl)->
      _vptr_BaseFunctor = (_func_int **)&PTR__BaseFunctor_0016c518;
      ((BaseFunctor *)
      ((long)local_330.functor._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)uVar6;
      local_330.valid = true;
      if (pSVar12[uVar10].index == pSVar12[uVar10].current) {
        *(ulong *)(uVar6 + 0x90) = uVar10 + 1;
        if (local_430 == &local_420) {
          local_380.field_2._8_8_ = local_420._8_8_;
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        }
        else {
          local_380._M_dataplus._M_p = (pointer)local_430;
        }
        local_380.field_2._M_allocated_capacity = local_420._M_allocated_capacity;
        local_380._M_string_length = local_428;
        local_428 = 0;
        local_420._M_allocated_capacity = local_420._M_allocated_capacity & 0xffffffffffffff00;
        local_430 = &local_420;
        WhenResultRecorder::push((WhenResultRecorder *)(uVar6 + 0x48),&local_380);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        local_3a8._M_dataplus._M_p = (pointer)operator_new(0x10);
        *(undefined ***)local_3a8._M_dataplus._M_p = &PTR__BaseFunctor_0016c558;
        *(undefined8 *)(local_3a8._M_dataplus._M_p + 8) = uVar6;
        local_3a8._M_string_length = CONCAT71(local_3a8._M_string_length._1_7_,1);
        local_3ec[4] = 0.0;
        local_3ec[3] = 0.0;
        local_3ec[2] = 60.0;
        local_3ec[1] = 0.0;
        local_208.lhs.operatorName = "&&";
        local_208.lhs.lhs.operatorName = "==";
        local_208.lhs.lhs.lhs.variableName = "result_a";
        local_208.lhs.lhs.lhs.value = local_3ec + 4;
        local_208.lhs.lhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_208.lhs.lhs.lhs.line = 0xe0;
        local_208.lhs.lhs.rhs.variableName = "result_d";
        local_208.lhs.lhs.rhs.value = local_3ec + 1;
        local_208.lhs.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_208.lhs.lhs.rhs.line = 0xe0;
        local_208.lhs.rhs.operatorName = "==";
        local_208.lhs.rhs.lhs.variableName = "result_c";
        local_208.lhs.rhs.lhs.value = local_3ec + 2;
        local_208.lhs.rhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_208.lhs.rhs.lhs.line = 0xe1;
        local_208.lhs.rhs.rhs.variableName = "-result_e";
        local_208.lhs.rhs.rhs.value = 60.0;
        local_208.lhs.rhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_208.lhs.rhs.rhs.line = 0xe1;
        local_208.rhs.operatorName = "==";
        local_208.rhs.lhs.variableName = "result_b";
        local_208.rhs.lhs.value = local_3ec + 3;
        local_208.rhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_208.rhs.lhs.line = 0xe2;
        local_208.rhs.rhs.variableName = "-result_a";
        local_208.rhs.rhs.value = -0.0;
        local_208.rhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_208.rhs.rhs.line = 0xe2;
        local_208.operatorName = "&&";
        Check::
        operator()<const_char_(&)[29],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>_>
                  ((Check *)local_268,(char (*) [29])"it yields the correct result",&local_208);
        Enhedron::Impl::Util::Finally::~Finally((Finally *)&local_3a8);
      }
      Enhedron::Impl::Util::Finally::~Finally(&local_330);
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420._M_allocated_capacity + 1);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410,local_400 + 1);
      }
      auVar20 = _DAT_00159240;
      auVar21 = _DAT_00159010;
      bVar7 = true;
      plVar8 = (long *)local_2e8._0_8_;
      while (plVar9 = (long *)local_2f8._8_8_, (long *)local_2f8._8_8_ != plVar8) {
        plVar9 = plVar8 + -2;
        if (plVar8[-1] != *plVar9 + 1) {
          *plVar9 = *plVar9 + 1;
          bVar7 = false;
          plVar9 = plVar8;
          break;
        }
        local_2e8._0_8_ = plVar9;
        plVar8 = plVar9;
      }
      lVar13 = local_320._8_8_ + local_268._8_8_;
      lVar16 = uStack_258 + lStack_310 + 1;
      lStack_310 = lVar16;
      local_320._8_8_ = lVar13;
      local_238 = local_308._0_8_ + local_250._0_8_;
      lStack_230 = local_250._8_8_ + local_308._8_8_;
      local_308._8_8_ = lStack_230;
      local_308._0_8_ = local_238;
      lVar14 = local_2f8._0_8_ + local_240;
      local_2f8._0_8_ = lVar14;
      plVar8 = (long *)local_2f8._8_8_;
    } while (!bVar7);
    if (lVar16 == 0) {
      lStack_310 = 1;
      lVar16 = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2a8);
    __return_storage_ptr__ = local_350;
    psVar15 = local_358;
    if ((char **)local_2c8 != local_2b8) {
      operator_delete(local_2c8,(ulong)(local_2b8[0] + 1));
    }
    if ((void *)local_2f8._8_8_ != (void *)0x0) {
      operator_delete((void *)local_2f8._8_8_,local_2e8._8_8_ - local_2f8._8_8_);
    }
    __return_storage_ptr__->fixtures_ = __return_storage_ptr__->fixtures_ + lVar13;
    __return_storage_ptr__->tests_ = lVar16 + __return_storage_ptr__->tests_;
    __return_storage_ptr__->checks_ = local_238 + __return_storage_ptr__->checks_;
    __return_storage_ptr__->failedTests_ = __return_storage_ptr__->failedTests_ + lStack_230;
    __return_storage_ptr__->failedChecks_ = __return_storage_ptr__->failedChecks_ + lVar14;
    results.value = local_360;
  }
  pRVar2 = ((results.value)->results_).value;
  (*pRVar2->_vptr_Results[6])(pRVar2,__return_storage_ptr__,local_348,psVar15);
  return __return_storage_ptr__;
}

Assistant:

virtual Stats run(const PathList& pathList, Out<ContextResultsRecorder> results, size_t depth) override {
            results->beginGiven(name);
            Stats stats;

            if (included(pathList, depth)) {
                stats += args.applyExtraBefore(runTest, name, results);
            }

            results->endGiven(stats, name);

            return stats;
        }